

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O1

void __thiscall TreeItem::~TreeItem(TreeItem *this)

{
  TreeItem *pTVar1;
  TreeItem *pTVar2;
  pointer pcVar3;
  
  for (pTVar1 = (TreeItem *)
                (this->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl
                ._M_node.super__List_node_base._M_next; pTVar1 != this;
      pTVar1 = (TreeItem *)
               (pTVar1->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
               _M_impl._M_node.super__List_node_base._M_next) {
    pTVar2 = (TreeItem *)
             (pTVar1->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
             _M_node._M_size;
    if (pTVar2 != (TreeItem *)0x0) {
      ~TreeItem(pTVar2);
      operator_delete(pTVar2);
    }
  }
  pcVar3 = (this->itemUncompressedData).d._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->itemUncompressedData).d.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->itemParsingData).d._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->itemParsingData).d.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->itemTail).d._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->itemTail).d.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->itemBody).d._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->itemBody).d.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->itemHeader).d._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->itemHeader).d.field_2) {
    operator_delete(pcVar3);
  }
  Bstrlib::CBString::~CBString(&this->itemInfo);
  Bstrlib::CBString::~CBString(&this->itemText);
  Bstrlib::CBString::~CBString(&this->itemName);
  pTVar1 = (TreeItem *)
           (this->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (pTVar1 != this) {
    pTVar2 = (TreeItem *)
             (pTVar1->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    operator_delete(pTVar1);
    pTVar1 = pTVar2;
  }
  return;
}

Assistant:

TreeItem::~TreeItem() {
    std::list<TreeItem*>::iterator begin = childItems.begin();
    while (begin != childItems.end()) {
        delete *begin;
        ++begin;
    }
}